

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O1

uint64_t aom_mse_wxh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  ulong uVar33;
  
  if (w == 8) {
    if (0 < h) {
      uVar28 = (ulong)(uint)h;
      lVar29 = 0;
      lVar32 = 0;
      do {
        uVar33 = *(ulong *)dst;
        auVar6._8_6_ = 0;
        auVar6._0_8_ = uVar33;
        auVar6[0xe] = (char)(uVar33 >> 0x38);
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar33;
        auVar8[0xc] = (char)(uVar33 >> 0x30);
        auVar8._13_2_ = auVar6._13_2_;
        auVar10._8_4_ = 0;
        auVar10._0_8_ = uVar33;
        auVar10._12_3_ = auVar8._12_3_;
        auVar12._8_2_ = 0;
        auVar12._0_8_ = uVar33;
        auVar12[10] = (char)(uVar33 >> 0x28);
        auVar12._11_4_ = auVar10._11_4_;
        auVar14._8_2_ = 0;
        auVar14._0_8_ = uVar33;
        auVar14._10_5_ = auVar12._10_5_;
        auVar16[8] = (char)(uVar33 >> 0x20);
        auVar16._0_8_ = uVar33;
        auVar16._9_6_ = auVar14._9_6_;
        auVar23._7_8_ = 0;
        auVar23._0_7_ = auVar16._8_7_;
        Var21 = CONCAT81(SUB158(auVar23 << 0x40,7),(char)(uVar33 >> 0x18));
        auVar26._9_6_ = 0;
        auVar26._0_9_ = Var21;
        auVar24._1_10_ = SUB1510(auVar26 << 0x30,5);
        auVar24[0] = (char)(uVar33 >> 0x10);
        auVar27._11_4_ = 0;
        auVar27._0_11_ = auVar24;
        auVar19[2] = (char)(uVar33 >> 8);
        auVar19._0_2_ = (ushort)uVar33;
        auVar19._3_12_ = SUB1512(auVar27 << 0x20,3);
        auVar31._0_2_ = *src - ((ushort)uVar33 & 0xff);
        auVar31._2_2_ = src[1] - auVar19._2_2_;
        auVar31._4_2_ = src[2] - auVar24._0_2_;
        auVar31._6_2_ = src[3] - (short)Var21;
        auVar31._8_2_ = src[4] - auVar16._8_2_;
        auVar31._10_2_ = src[5] - auVar12._10_2_;
        auVar31._12_2_ = src[6] - auVar8._12_2_;
        auVar31._14_2_ = src[7] - (auVar6._13_2_ >> 8);
        auVar31 = pmaddwd(auVar31,auVar31);
        lVar29 = (ulong)auVar31._8_4_ + lVar29 + (auVar31._0_8_ & 0xffffffff);
        lVar32 = (ulong)auVar31._12_4_ + lVar32 + (ulong)auVar31._4_4_;
        src = src + sstride;
        dst = (uint8_t *)((long)dst + (long)dstride);
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
      goto LAB_00314018;
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    if (0 < h) {
      uVar28 = 0;
      lVar29 = 0;
      lVar32 = 0;
      do {
        uVar3 = *(undefined4 *)(dst + dstride);
        uVar4 = *(undefined4 *)dst;
        uVar33 = CONCAT44(uVar3,uVar4);
        auVar5._8_6_ = 0;
        auVar5._0_8_ = uVar33;
        auVar5[0xe] = (char)((uint)uVar3 >> 0x18);
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar33;
        auVar7[0xc] = (char)((uint)uVar3 >> 0x10);
        auVar7._13_2_ = auVar5._13_2_;
        auVar9._8_4_ = 0;
        auVar9._0_8_ = uVar33;
        auVar9._12_3_ = auVar7._12_3_;
        auVar11._8_2_ = 0;
        auVar11._0_8_ = uVar33;
        auVar11[10] = (char)((uint)uVar3 >> 8);
        auVar11._11_4_ = auVar9._11_4_;
        auVar13._8_2_ = 0;
        auVar13._0_8_ = uVar33;
        auVar13._10_5_ = auVar11._10_5_;
        auVar15[8] = (char)uVar3;
        auVar15._0_8_ = uVar33;
        auVar15._9_6_ = auVar13._9_6_;
        auVar20._7_8_ = 0;
        auVar20._0_7_ = auVar15._8_7_;
        Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)((uint)uVar4 >> 0x18));
        auVar25._9_6_ = 0;
        auVar25._0_9_ = Var21;
        auVar17[4] = (char)((uint)uVar4 >> 0x10);
        auVar17._0_4_ = uVar4;
        auVar17._5_10_ = SUB1510(auVar25 << 0x30,5);
        auVar22._11_4_ = 0;
        auVar22._0_11_ = auVar17._4_11_;
        auVar18[2] = (char)((uint)uVar4 >> 8);
        auVar18._0_2_ = (ushort)uVar4;
        auVar18._3_12_ = SUB1512(auVar22 << 0x20,3);
        uVar1 = *(undefined8 *)(src + sstride);
        uVar2 = *(undefined8 *)src;
        auVar30._0_2_ = (short)uVar2 - ((ushort)uVar4 & 0xff);
        auVar30._2_2_ = (short)((ulong)uVar2 >> 0x10) - auVar18._2_2_;
        auVar30._4_2_ = (short)((ulong)uVar2 >> 0x20) - auVar17._4_2_;
        auVar30._6_2_ = (short)((ulong)uVar2 >> 0x30) - (short)Var21;
        auVar30._8_2_ = (short)uVar1 - auVar15._8_2_;
        auVar30._10_2_ = (short)((ulong)uVar1 >> 0x10) - auVar11._10_2_;
        auVar30._12_2_ = (short)((ulong)uVar1 >> 0x20) - auVar7._12_2_;
        auVar30._14_2_ = (short)((ulong)uVar1 >> 0x30) - (auVar5._13_2_ >> 8);
        auVar31 = pmaddwd(auVar30,auVar30);
        lVar29 = (ulong)auVar31._8_4_ + lVar29 + (auVar31._0_8_ & 0xffffffff);
        lVar32 = (ulong)auVar31._12_4_ + lVar32 + (ulong)auVar31._4_4_;
        uVar28 = uVar28 + 2;
        src = src + (long)sstride * 2;
        dst = dst + (long)dstride * 2;
      } while (uVar28 < (uint)h);
      goto LAB_00314018;
    }
  }
  lVar29 = 0;
  lVar32 = 0;
LAB_00314018:
  return lVar32 + lVar29;
}

Assistant:

uint64_t aom_mse_wxh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                int sstride, int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_sse2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_sse2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}